

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall FloatInterval_Div_Test::~FloatInterval_Div_Test(FloatInterval_Div_Test *this)

{
  void *in_RDI;
  
  ~FloatInterval_Div_Test((FloatInterval_Div_Test *)0x608738);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(FloatInterval, Div) {
    for (int trial = 0; trial < kFloatIntervalIters; ++trial) {
        RNG rng(trial);

        FloatInterval ef[2] = {getFloat(rng), getFloat(rng)};
        double precise[2] = {getPrecise(ef[0], rng), getPrecise(ef[1], rng)};

        // Things get messy if the denominator's interval straddles zero...
        if (ef[1].LowerBound() * ef[1].UpperBound() < 0.)
            continue;

        FloatInterval efResult = ef[0] / ef[1];
        float preciseResult = precise[0] / precise[1];

        EXPECT_GE(preciseResult, efResult.LowerBound());
        EXPECT_LE(preciseResult, efResult.UpperBound());
    }
}